

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

void JPCommonLabelWord_initialize
               (JPCommonLabelWord *w,char *pron,char *pos,char *ctype,char *cform,
               JPCommonLabelMora *head,JPCommonLabelMora *tail,JPCommonLabelWord *prev,
               JPCommonLabelWord *next)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  undefined8 in_R9;
  int find;
  int i;
  int local_34;
  
  pcVar3 = strdup(in_RSI);
  *in_RDI = pcVar3;
  bVar1 = false;
  for (local_34 = 0; jpcommon_pos_list[local_34] != (char *)0x0; local_34 = local_34 + 2) {
    iVar2 = strcmp(jpcommon_pos_list[local_34],in_RDX);
    if (iVar2 == 0) {
      bVar1 = true;
      break;
    }
  }
  if (!bVar1) {
    fprintf(_stderr,
            "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown POS.\n",
            in_RDX);
    local_34 = 0;
  }
  pcVar3 = strdup(jpcommon_pos_list[local_34 + 1]);
  in_RDI[1] = pcVar3;
  bVar1 = false;
  for (local_34 = 0; jpcommon_ctype_list[local_34] != (char *)0x0; local_34 = local_34 + 2) {
    iVar2 = strcmp(jpcommon_ctype_list[local_34],in_RCX);
    if (iVar2 == 0) {
      bVar1 = true;
      break;
    }
  }
  if (!bVar1) {
    fprintf(_stderr,
            "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown conjugation type.\n"
            ,in_RCX);
    local_34 = 0;
  }
  pcVar3 = strdup(jpcommon_ctype_list[local_34 + 1]);
  in_RDI[2] = pcVar3;
  local_34 = 0;
  bVar1 = false;
  do {
    if (jpcommon_cform_list[local_34] == (char *)0x0) {
LAB_00188933:
      if (!bVar1) {
        fprintf(_stderr,
                "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown conjugation form .\n"
                ,in_R8);
        local_34 = 0;
      }
      pcVar3 = strdup(jpcommon_cform_list[local_34 + 1]);
      in_RDI[3] = pcVar3;
      in_RDI[4] = in_R9;
      in_RDI[5] = head;
      in_RDI[6] = cform;
      in_RDI[7] = ctype;
      return;
    }
    iVar2 = strcmp(jpcommon_cform_list[local_34],in_R8);
    if (iVar2 == 0) {
      bVar1 = true;
      goto LAB_00188933;
    }
    local_34 = local_34 + 2;
  } while( true );
}

Assistant:

static void JPCommonLabelWord_initialize(JPCommonLabelWord * w, const char *pron, const char *pos,
                                         const char *ctype, const char *cform,
                                         JPCommonLabelMora * head, JPCommonLabelMora * tail,
                                         JPCommonLabelWord * prev, JPCommonLabelWord * next)
{
   int i, find;

   w->pron = strdup(pron);
   for (i = 0, find = 0; jpcommon_pos_list[i] != NULL; i += 2) {
      if (strcmp(jpcommon_pos_list[i], pos) == 0) {
         find = 1;
         break;
      }
   }
   if (find == 0) {
      fprintf(stderr,
              "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown POS.\n",
              pos);
      i = 0;
   }
   w->pos = strdup(jpcommon_pos_list[i + 1]);
   for (i = 0, find = 0; jpcommon_ctype_list[i] != NULL; i += 2) {
      if (strcmp(jpcommon_ctype_list[i], ctype) == 0) {
         find = 1;
         break;
      }
   }
   if (find == 0) {
      fprintf(stderr,
              "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown conjugation type.\n",
              ctype);
      i = 0;
   }
   w->ctype = strdup(jpcommon_ctype_list[i + 1]);
   for (i = 0, find = 0; jpcommon_cform_list[i] != NULL; i += 2) {
      if (strcmp(jpcommon_cform_list[i], cform) == 0) {
         find = 1;
         break;
      }
   }
   if (find == 0) {
      fprintf(stderr,
              "WARNING: JPCommonLabelWord_initialize() in jpcommon_label.c: %s is unknown conjugation form .\n",
              cform);
      i = 0;
   }
   w->cform = strdup(jpcommon_cform_list[i + 1]);
   w->head = head;
   w->tail = tail;
   w->prev = prev;
   w->next = next;
}